

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hash.c
# Opt level: O0

void test_hash_matches_failing_on_wrong_input(void)

{
  byte bVar1;
  unsigned_long_long atto_idx_3;
  unsigned_long_long atto_idx_2;
  unsigned_long_long atto_idx_1;
  unsigned_long_long atto_idx;
  _Bool is_tag_valid;
  uint8_t expected_digest [32];
  uint8_t dummy_data [6];
  ascon_hash_ctx_t hash_ctx;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  char local_68 [31];
  char local_49;
  undefined4 local_46;
  undefined2 local_42;
  char local_40 [64];
  
  local_46 = 0x64636261;
  local_42 = 0x65;
  ascon_hash_init(local_40);
  ascon_hash_update(local_40,&local_46,6);
  ascon_hash_final(local_40,local_68);
  ascon_hash_init(local_40);
  ascon_hash_update(local_40,&local_46,6);
  bVar1 = ascon_hash_final_matches(local_40,local_68);
  if ((bVar1 & 1) == 1) {
    for (local_78 = 0; local_78 < 0x40; local_78 = local_78 + 1) {
      if (local_40[local_78] != '\0') {
        printf("FAIL | File: %s:%d | Test case: %s | Ctr: %llu\n",
               "/workspace/llm4binary/github/license_all_cmakelists_1510/TheMatjaz[P]LibAscon/tst/test_hash.c"
               ,0x23f,"test_hash_matches_failing_on_wrong_input",atto_counter);
        atto_at_least_one_fail = '\x01';
        return;
      }
    }
    local_46._0_2_ = CONCAT11(0x58,(undefined1)local_46);
    ascon_hash_init(local_40);
    ascon_hash_update(local_40,&local_46,6);
    bVar1 = ascon_hash_final_matches(local_40,local_68);
    if ((bVar1 & 1) == 0) {
      for (local_80 = 0; local_80 < 0x40; local_80 = local_80 + 1) {
        if (local_40[local_80] != '\0') {
          printf("FAIL | File: %s:%d | Test case: %s | Ctr: %llu\n",
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/TheMatjaz[P]LibAscon/tst/test_hash.c"
                 ,0x247,"test_hash_matches_failing_on_wrong_input",atto_counter);
          atto_at_least_one_fail = '\x01';
          return;
        }
      }
      ascon_hash(local_68,&local_46,6);
      if (local_49 == -1) {
        printf("FAIL | File: %s:%d | Test case: %s | Ctr: %llu\n",
               "/workspace/llm4binary/github/license_all_cmakelists_1510/TheMatjaz[P]LibAscon/tst/test_hash.c"
               ,0x24d,"test_hash_matches_failing_on_wrong_input",atto_counter);
        atto_at_least_one_fail = '\x01';
      }
      else {
        local_49 = 0xff;
        ascon_hash_init(local_40);
        ascon_hash_update(local_40,&local_46,6);
        bVar1 = ascon_hash_final_matches(local_40,local_68);
        if ((bVar1 & 1) == 0) {
          for (local_88 = 0; local_88 < 0x40; local_88 = local_88 + 1) {
            if (local_40[local_88] != '\0') {
              printf("FAIL | File: %s:%d | Test case: %s | Ctr: %llu\n",
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/TheMatjaz[P]LibAscon/tst/test_hash.c"
                     ,0x253,"test_hash_matches_failing_on_wrong_input",atto_counter);
              atto_at_least_one_fail = '\x01';
              return;
            }
          }
          if (local_68[0] == -1) {
            printf("FAIL | File: %s:%d | Test case: %s | Ctr: %llu\n",
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/TheMatjaz[P]LibAscon/tst/test_hash.c"
                   ,0x256,"test_hash_matches_failing_on_wrong_input",atto_counter);
            atto_at_least_one_fail = '\x01';
          }
          else {
            local_68[0] = -1;
            ascon_hash_init(local_40);
            ascon_hash_update(local_40,&local_46,6);
            bVar1 = ascon_hash_final_matches(local_40,local_68);
            if ((bVar1 & 1) == 0) {
              for (local_90 = 0; local_90 < 0x40; local_90 = local_90 + 1) {
                if (local_40[local_90] != '\0') {
                  printf("FAIL | File: %s:%d | Test case: %s | Ctr: %llu\n",
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/TheMatjaz[P]LibAscon/tst/test_hash.c"
                         ,0x25c,"test_hash_matches_failing_on_wrong_input",atto_counter);
                  atto_at_least_one_fail = '\x01';
                  return;
                }
              }
            }
            else {
              printf("FAIL | File: %s:%d | Test case: %s | Ctr: %llu\n",
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/TheMatjaz[P]LibAscon/tst/test_hash.c"
                     ,0x25b,"test_hash_matches_failing_on_wrong_input",atto_counter);
              atto_at_least_one_fail = '\x01';
            }
          }
        }
        else {
          printf("FAIL | File: %s:%d | Test case: %s | Ctr: %llu\n",
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/TheMatjaz[P]LibAscon/tst/test_hash.c"
                 ,0x252,"test_hash_matches_failing_on_wrong_input",atto_counter);
          atto_at_least_one_fail = '\x01';
        }
      }
    }
    else {
      printf("FAIL | File: %s:%d | Test case: %s | Ctr: %llu\n",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/TheMatjaz[P]LibAscon/tst/test_hash.c"
             ,0x246,"test_hash_matches_failing_on_wrong_input",atto_counter);
      atto_at_least_one_fail = '\x01';
    }
  }
  else {
    printf("FAIL | File: %s:%d | Test case: %s | Ctr: %llu\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/TheMatjaz[P]LibAscon/tst/test_hash.c"
           ,0x23e,"test_hash_matches_failing_on_wrong_input",atto_counter);
    atto_at_least_one_fail = '\x01';
  }
  return;
}

Assistant:

static void test_hash_matches_failing_on_wrong_input(void)
{
    ascon_hash_ctx_t hash_ctx;
    uint8_t dummy_data[] = "abcde";
    uint8_t expected_digest[ASCON_HASH_DIGEST_LEN];

    // Generate the digest
    ascon_hash_init(&hash_ctx);
    ascon_hash_update(&hash_ctx, dummy_data, sizeof(dummy_data));
    ascon_hash_final(&hash_ctx, expected_digest);

    // Digest matches when done the same way
    ascon_hash_init(&hash_ctx);
    ascon_hash_update(&hash_ctx, dummy_data, sizeof(dummy_data));
    bool is_tag_valid = ascon_hash_final_matches(&hash_ctx, expected_digest);
    atto_eq(is_tag_valid, ASCON_TAG_OK);
    atto_zeros(&hash_ctx, sizeof(ascon_hash_ctx_t));

    // Digest does NOT match when data is altered
    dummy_data[1] = 'X';
    ascon_hash_init(&hash_ctx);
    ascon_hash_update(&hash_ctx, dummy_data, sizeof(dummy_data));
    is_tag_valid = ascon_hash_final_matches(&hash_ctx, expected_digest);
    atto_eq(is_tag_valid, ASCON_TAG_INVALID);
    atto_zeros(&hash_ctx, sizeof(ascon_hash_ctx_t));

    // Generate digest again
    ascon_hash(expected_digest, dummy_data, sizeof(dummy_data));

    // Enforcing branch when digest differs in last block
    atto_neq(expected_digest[31], 0xFF);
    expected_digest[31] = 0xFF;
    ascon_hash_init(&hash_ctx);
    ascon_hash_update(&hash_ctx, dummy_data, sizeof(dummy_data));
    is_tag_valid = ascon_hash_final_matches(&hash_ctx, expected_digest);
    atto_eq(is_tag_valid, ASCON_TAG_INVALID);
    atto_zeros(&hash_ctx, sizeof(ascon_hash_ctx_t));

    // Enforcing branch when digest differs in first block
    atto_neq(expected_digest[0], 0xFF);
    expected_digest[0] = 0xFF;
    ascon_hash_init(&hash_ctx);
    ascon_hash_update(&hash_ctx, dummy_data, sizeof(dummy_data));
    is_tag_valid = ascon_hash_final_matches(&hash_ctx, expected_digest);
    atto_eq(is_tag_valid, ASCON_TAG_INVALID);
    atto_zeros(&hash_ctx, sizeof(ascon_hash_ctx_t));
}